

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

bool __thiscall Socket::makeLinger(Socket *this,bool enabled)

{
  int iVar1;
  undefined7 in_register_00000031;
  undefined4 local_10;
  undefined4 local_c;
  linger so_linger;
  
  local_10 = (undefined4)CONCAT71(in_register_00000031,enabled);
  local_c = 0;
  iVar1 = setsockopt(this->_fd,1,0xd,&local_10,8);
  return iVar1 != -1;
}

Assistant:

bool Socket::makeLinger( bool enabled )
{
    struct linger so_linger;
    so_linger.l_onoff = enabled ? 1 : 0;
    so_linger.l_linger = 0;
    if(setsockopt(_fd, SOL_SOCKET, SO_LINGER, (const char *)&so_linger, sizeof(so_linger)) == SOCKET_ERROR)
        return false;
    return true;
}